

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

void __thiscall
minibag::View::View(View *this,Bag *bag,function<bool_(const_minibag::ConnectionInfo_*)> *query,
                   Time *start_time,Time *end_time,bool *reduce_overlap)

{
  function<bool_(const_minibag::ConnectionInfo_*)> local_40;
  
  *(undefined8 *)
   ((long)&(this->queries_).
           super__Vector_base<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  this->size_cache_ = 0;
  this->size_revision_ = 0;
  (this->queries_).super__Vector_base<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->queries_).super__Vector_base<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ranges_).
  super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->queries_).super__Vector_base<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ranges_).
  super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ranges_).
  super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->reduce_overlap_ = *reduce_overlap;
  std::function<bool_(const_minibag::ConnectionInfo_*)>::function(&local_40,query);
  addQuery(this,bag,&local_40,start_time,end_time);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return;
}

Assistant:

View::View(Bag const& bag, std::function<bool(ConnectionInfo const*)> query, miniros::Time const& start_time, miniros::Time const& end_time, bool const& reduce_overlap) : view_revision_(0), size_cache_(0), size_revision_(0), reduce_overlap_(reduce_overlap) {
	addQuery(bag, query, start_time, end_time);
}